

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::hsvToRGB<int>(int *red,int *green,int *blue,int maxval,float hue,float sat,float val)

{
  int in_ECX;
  int iVar1;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float t;
  float q;
  float p;
  float f;
  int i;
  
  fVar2 = (float)in_ECX * in_XMM2_Da;
  if ((in_XMM1_Da != 0.0) || (NAN(in_XMM1_Da))) {
    fVar3 = floorf(in_XMM0_Da);
    fVar4 = in_XMM0_Da - (float)(int)fVar3;
    fVar5 = fVar2 * (1.0 - in_XMM1_Da);
    fVar6 = fVar2 * (1.0 - fVar4 * in_XMM1_Da);
    fVar4 = fVar2 * (1.0 - in_XMM1_Da * (1.0 - fVar4));
    switch((int)fVar3) {
    case 0:
      *in_RDI = (int)(fVar2 + 0.5);
      *in_RSI = (int)(fVar4 + 0.5);
      *in_RDX = (int)(fVar5 + 0.5);
      break;
    case 1:
      *in_RDI = (int)(fVar6 + 0.5);
      *in_RSI = (int)(fVar2 + 0.5);
      *in_RDX = (int)(fVar5 + 0.5);
      break;
    case 2:
      *in_RDI = (int)(fVar5 + 0.5);
      *in_RSI = (int)(fVar2 + 0.5);
      *in_RDX = (int)(fVar4 + 0.5);
      break;
    case 3:
      *in_RDI = (int)(fVar5 + 0.5);
      *in_RSI = (int)(fVar6 + 0.5);
      *in_RDX = (int)(fVar2 + 0.5);
      break;
    case 4:
      *in_RDI = (int)(fVar4 + 0.5);
      *in_RSI = (int)(fVar5 + 0.5);
      *in_RDX = (int)(fVar2 + 0.5);
      break;
    default:
      *in_RDI = (int)(fVar2 + 0.5);
      *in_RSI = (int)(fVar5 + 0.5);
      *in_RDX = (int)(fVar6 + 0.5);
    }
  }
  else {
    iVar1 = (int)(fVar2 + 0.5);
    *in_RDX = iVar1;
    *in_RSI = iVar1;
    *in_RDI = iVar1;
  }
  return;
}

Assistant:

void hsvToRGB(T &red, T &green, T &blue, T maxval, float hue, float sat, float val)
{
  val*=maxval;

  if (sat != 0)
  {
    int   i=static_cast<int>(floorf(hue));
    float f=hue-i;
    float p=val*(1-sat);
    float q=val*(1-f*sat);
    float t=val*(1-sat*(1-f));

    switch (i)
    {
      case 0:
        red=static_cast<T>(val+0.5f);
        green=static_cast<T>(t+0.5f);
        blue=static_cast<T>(p+0.5f);
        break;

      case 1:
        red=static_cast<T>(q+0.5f);
        green=static_cast<T>(val+0.5f);
        blue=static_cast<T>(p+0.5f);
        break;

      case 2:
        red=static_cast<T>(p+0.5f);
        green=static_cast<T>(val+0.5f);
        blue=static_cast<T>(t+0.5f);
        break;

      case 3:
        red=static_cast<T>(p+0.5f);
        green=static_cast<T>(q+0.5f);
        blue=static_cast<T>(val+0.5f);
        break;

      case 4:
        red=static_cast<T>(t+0.5f);
        green=static_cast<T>(p+0.5f);
        blue=static_cast<T>(val+0.5f);
        break;

      default:
        red=static_cast<T>(val+0.5f);
        green=static_cast<T>(p+0.5f);
        blue=static_cast<T>(q+0.5f);
        break;
    }
  }
  else
  {
    red=green=blue=static_cast<T>(val+0.5f);
  }
}